

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::AddOutPt(Clipper *this,TEdge *e,IntPoint *pt)

{
  PolyOutList *this_00;
  EdgeSide EVar1;
  EdgeSide EVar2;
  int iVar3;
  OutRec *pOVar4;
  iterator __position;
  long lVar5;
  OutPt *pOVar6;
  long64 lVar7;
  OutPt *pOVar8;
  TEdge *pTVar9;
  OutPt *pOVar10;
  bool bVar11;
  pointer ppOVar12;
  EdgeSide EVar13;
  long lVar14;
  long lVar15;
  OutRec *outRec;
  OutRec *local_38;
  
  if ((long)e->outIdx < 0) {
    local_38 = (OutRec *)operator_new(0x38);
    local_38->isHole = false;
    local_38->FirstLeft = (OutRec *)0x0;
    local_38->AppendLink = (OutRec *)0x0;
    local_38->pts = (OutPt *)0x0;
    local_38->bottomPt = (OutPt *)0x0;
    *(undefined8 *)((long)&local_38->bottomPt + 4) = 0;
    *(undefined8 *)((long)&local_38->bottomFlag + 4) = 0;
    this_00 = &this->m_PolyOuts;
    __position._M_current =
         (this->m_PolyOuts).
         super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_PolyOuts).
        super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>>::
      _M_realloc_insert<ClipperLib::OutRec*const&>
                ((vector<ClipperLib::OutRec*,std::allocator<ClipperLib::OutRec*>> *)this_00,
                 __position,&local_38);
      ppOVar12 = (this->m_PolyOuts).
                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = local_38;
      ppOVar12 = (this->m_PolyOuts).
                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
      (this->m_PolyOuts).
      super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppOVar12;
    }
    pOVar4 = local_38;
    local_38->idx =
         (int)((ulong)((long)ppOVar12 -
                      (long)(this_00->
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                            )._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    iVar3 = local_38->idx;
    e->outIdx = iVar3;
    pOVar8 = (OutPt *)operator_new(0x28);
    pOVar4->pts = pOVar8;
    pOVar4->bottomPt = pOVar8;
    lVar7 = pt->Y;
    (pOVar8->pt).X = pt->X;
    (pOVar8->pt).Y = lVar7;
    pOVar8->idx = iVar3;
    pOVar8->next = pOVar8;
    pOVar8->prev = pOVar8;
    pTVar9 = e->prevInAEL;
    if (pTVar9 == (TEdge *)0x0) {
      return;
    }
    bVar11 = false;
    do {
      if ((-1 < (long)pTVar9->outIdx) &&
         (bVar11 = (bool)(bVar11 ^ 1), pOVar4->FirstLeft == (OutRec *)0x0)) {
        pOVar4->FirstLeft =
             (this_00->
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>).
             _M_impl.super__Vector_impl_data._M_start[pTVar9->outIdx];
      }
      pTVar9 = pTVar9->prevInAEL;
    } while (pTVar9 != (TEdge *)0x0);
    if (!bVar11) {
      return;
    }
    pOVar4->isHole = true;
    return;
  }
  EVar1 = e->side;
  pOVar4 = (this->m_PolyOuts).
           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
           super__Vector_impl_data._M_start[e->outIdx];
  pOVar8 = pOVar4->pts;
  if (EVar1 == esLeft) {
    lVar14 = pt->X;
    lVar15 = pt->Y;
    if ((lVar14 == (pOVar8->pt).X) && (lVar15 == (pOVar8->pt).Y)) {
      return;
    }
  }
  else {
    lVar14 = pt->X;
    lVar15 = pt->Y;
    if ((lVar14 == (pOVar8->prev->pt).X) && (lVar15 == (pOVar8->prev->pt).Y)) {
      return;
    }
  }
  EVar2 = pOVar4->sides;
  EVar13 = EVar2 | EVar1;
  if (EVar13 == EVar2) goto LAB_00660d40;
  if ((EVar2 == esNeither) && (lVar15 == (pOVar8->pt).Y)) {
    lVar15 = (pOVar8->pt).X;
    if (EVar1 == esLeft) {
      if (lVar14 == lVar15 + 1) {
        return;
      }
      pOVar4->sides = EVar13;
      if (EVar13 != esBoth) goto LAB_00660d40;
      goto LAB_00660ca6;
    }
    if (lVar14 == lVar15 + -1) {
      return;
    }
    pOVar4->sides = EVar13;
    if (EVar13 != esBoth) goto LAB_00660d40;
LAB_00660cfe:
    pOVar10 = pOVar8->prev;
    lVar14 = (pOVar10->pt).Y;
    lVar15 = lVar14 - (pOVar10->prev->pt).Y;
    if (((lVar15 == 0) || (lVar14 = lVar14 - pt->Y, lVar14 == 0)) ||
       (lVar5 = (pOVar10->pt).X,
       (lVar5 - pt->X) / lVar14 <= (lVar5 - (pOVar10->prev->pt).X) / lVar15)) goto LAB_00660d40;
  }
  else {
    pOVar4->sides = EVar13;
    if (EVar13 != esBoth) goto LAB_00660d40;
    if (EVar1 != esLeft) goto LAB_00660cfe;
LAB_00660ca6:
    lVar14 = (pOVar8->pt).Y;
    lVar15 = lVar14 - (pOVar8->next->pt).Y;
    if (((lVar15 == 0) || (lVar14 = lVar14 - pt->Y, lVar14 == 0)) ||
       (lVar5 = (pOVar8->pt).X, pOVar10 = pOVar8,
       (lVar5 - (pOVar8->next->pt).X) / lVar15 <= (lVar5 - pt->X) / lVar14)) goto LAB_00660d40;
  }
  pOVar4->bottomFlag = pOVar10;
LAB_00660d40:
  pOVar10 = (OutPt *)operator_new(0x28);
  lVar7 = pt->Y;
  (pOVar10->pt).X = pt->X;
  (pOVar10->pt).Y = lVar7;
  pOVar10->idx = pOVar4->idx;
  if (((pOVar10->pt).Y == (pOVar4->bottomPt->pt).Y) && ((pOVar10->pt).X < (pOVar4->bottomPt->pt).X))
  {
    pOVar4->bottomPt = pOVar10;
  }
  pOVar10->next = pOVar8;
  pOVar6 = pOVar8->prev;
  pOVar10->prev = pOVar6;
  pOVar6->next = pOVar10;
  pOVar8->prev = pOVar10;
  if (EVar1 == esLeft) {
    pOVar4->pts = pOVar10;
  }
  return;
}

Assistant:

void Clipper::AddOutPt(TEdge *e, const IntPoint &pt)
{
  bool ToFront = (e->side == esLeft);
  if(  e->outIdx < 0 )
  {
    OutRec *outRec = CreateOutRec();
    m_PolyOuts.push_back(outRec);
    outRec->idx = (int)m_PolyOuts.size()-1;
    e->outIdx = outRec->idx;
    OutPt* op = new OutPt;
    outRec->pts = op;
    outRec->bottomPt = op;
    op->pt = pt;
    op->idx = outRec->idx;
    op->next = op;
    op->prev = op;
    SetHoleState(e, outRec);
  } else
  {
    OutRec *outRec = m_PolyOuts[e->outIdx];
    OutPt* op = outRec->pts;
    if ((ToFront && PointsEqual(pt, op->pt)) ||
      (!ToFront && PointsEqual(pt, op->prev->pt))) return;

    if ((e->side | outRec->sides) != outRec->sides)
    {
      //check for 'rounding' artefacts ...
      if (outRec->sides == esNeither && pt.Y == op->pt.Y)
      {
        if (ToFront)
        {
          if (pt.X == op->pt.X +1) return;    //ie wrong side of bottomPt
        }
        else if (pt.X == op->pt.X -1) return; //ie wrong side of bottomPt
      }

      outRec->sides = (EdgeSide)(outRec->sides | e->side);
      if (outRec->sides == esBoth)
      {
        //A vertex from each side has now been added.
        //Vertices of one side of an output polygon are quite commonly close to
        //or even 'touching' edges of the other side of the output polygon.
        //Very occasionally vertices from one side can 'cross' an edge on the
        //the other side. The distance 'crossed' is always less that a unit
        //and is purely an artefact of coordinate rounding. Nevertheless, this
        //results in very tiny self-intersections. Because of the way
        //orientation is calculated, even tiny self-intersections can cause
        //the Orientation function to return the wrong result. Therefore, it's
        //important to ensure that any self-intersections close to BottomPt are
        //detected and removed before orientation is assigned.

        OutPt *opBot, *op2;
        if (ToFront)
        {
          opBot = outRec->pts;
          op2 = opBot->next; //op2 == right side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) <
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        } else
        {
          opBot = outRec->pts->prev;
          op2 = opBot->prev; //op2 == left side
          if (opBot->pt.Y != op2->pt.Y && opBot->pt.Y != pt.Y &&
            ((opBot->pt.X - pt.X)/(opBot->pt.Y - pt.Y) >
            (opBot->pt.X - op2->pt.X)/(opBot->pt.Y - op2->pt.Y)))
               outRec->bottomFlag = opBot;
        }
      }
    }

    OutPt* op2 = new OutPt;
    op2->pt = pt;
    op2->idx = outRec->idx;
    if (op2->pt.Y == outRec->bottomPt->pt.Y &&
      op2->pt.X < outRec->bottomPt->pt.X)
        outRec->bottomPt = op2;
    op2->next = op;
    op2->prev = op->prev;
    op2->prev->next = op2;
    op->prev = op2;
    if (ToFront) outRec->pts = op2;
  }
}